

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall CRegexParser::add_range_class(CRegexParser *this,re_recog_type cl)

{
  size_t sVar1;
  
  ensure_range_buf_space(this);
  sVar1 = this->range_buf_cnt_;
  this->range_buf_cnt_ = sVar1 + 1;
  this->range_buf_[sVar1] = L'\0';
  sVar1 = this->range_buf_cnt_;
  this->range_buf_cnt_ = sVar1 + 1;
  this->range_buf_[sVar1] = cl;
  return;
}

Assistant:

void CRegexParser::add_range_class(re_recog_type cl)
{
    /* make sure we have space in the range buffer */
    ensure_range_buf_space();

    /* 
     *   add the new entry - the first character of the pair is a null
     *   character to indicate that the entry represents a class, and the
     *   second of the pair is the type code 
     */
    range_buf_[range_buf_cnt_++] = 0;
    range_buf_[range_buf_cnt_++] = (wchar_t)cl;
}